

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O0

Address * __thiscall Address::getCity_abi_cxx11_(Address *this)

{
  long in_RSI;
  Address *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x20));
  return this;
}

Assistant:

string Address::getCity() {
    return city;
}